

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxVMFunctionCall::Resolve(FxVMFunctionCall *this,FCompileContext *ctx)

{
  PFunction *pPVar1;
  PType *pPVar2;
  FxExpression **ppFVar3;
  PClass *pPVar4;
  TArray<FxExpression_*,_FxExpression_*> *pTVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PPointer *pPVar9;
  FxExpression *pFVar10;
  FxTypeCast *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PClass *pPVar11;
  FxConstant *this_01;
  PVoidType **ppPVar12;
  uint uVar13;
  char *message;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  PPrototype *pPVar19;
  bool bVar20;
  bool writable;
  PType *local_a0;
  undefined1 local_91;
  FScriptPosition *local_90;
  Variant *local_88;
  TArray<FxExpression_*,_FxExpression_*> *local_80;
  ulong local_78;
  ulong local_70;
  FCompileContext *local_68;
  ulong local_60;
  PPrototype *local_58;
  FxVMFunctionCall *local_50;
  ulong local_48;
  VMFunction *local_40;
  FxConstant *local_38;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar10 = this->Self;
  if (pFVar10 != (FxExpression *)0x0) {
    iVar6 = (*pFVar10->_vptr_FxExpression[2])(pFVar10,ctx);
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar6);
    if ((FxExpression *)CONCAT44(extraout_var,iVar6) == (FxExpression *)0x0) goto LAB_0053746e;
  }
  pPVar1 = this->Function;
  local_88 = (pPVar1->Variants).Array;
  pPVar19 = local_88->Proto;
  local_40 = local_88->Implementation;
  uVar13 = local_88->Flags;
  uVar17 = 3;
  if ((uVar13 & 4) == 0) {
    uVar17 = (ulong)(uVar13 >> 1 & 1);
  }
  if ((this->Self == (FxExpression *)0x0) && ((uVar13 & 2) != 0)) {
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,
               "Call to non-static function without a self pointer");
    goto LAB_0053746e;
  }
  uVar13 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
  if (uVar13 == 0) {
    if ((((uint)uVar17 < (pPVar19->ArgumentTypes).Count) &&
        ((pPVar19->ArgumentTypes).Array[uVar17] != (PType *)0x0)) &&
       (((local_88->ArgFlags).Array[uVar17] & 1) == 0)) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Insufficient arguments in call to %s"
                 ,FName::NameData.NameArray
                  [*(int *)&(pPVar1->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text);
      goto LAB_0053746e;
    }
    uVar15 = 0;
  }
  else {
    uVar7 = (pPVar19->ArgumentTypes).Count;
    if (((pPVar19->ArgumentTypes).Array[uVar7 - 1] == (PType *)0x0) ||
       (uVar13 + (uint)uVar17 <= uVar7)) {
      local_78 = uVar17;
      if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
        uVar15 = 0;
      }
      else {
        local_80 = &(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>;
        local_90 = &(this->super_FxExpression).ScriptPosition;
        uVar18 = 0;
        uVar15 = 0;
        local_60 = 0;
        local_a0 = (PType *)0x0;
        uVar13 = 0;
        local_70 = uVar17;
        local_68 = ctx;
        local_58 = pPVar19;
        do {
          iVar6 = (int)uVar18;
          if ((local_60 & 1) == 0) {
            uVar7 = (int)local_78 + iVar6;
            pPVar2 = (pPVar19->ArgumentTypes).Array[uVar7];
            if (pPVar2 == (PType *)0x0) {
              local_60 = CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
            }
            else {
              uVar13 = (local_88->ArgFlags).Array[uVar7];
              local_a0 = pPVar2;
            }
          }
          if (local_a0 == (PType *)0x0) {
            __assert_fail("type != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0x1e8c,
                          "virtual FxExpression *FxVMFunctionCall::Resolve(FCompileContext &)");
          }
          ppFVar3 = ((TArray<FxExpression_*,_FxExpression_*> *)&local_80->Array)->Array;
          pFVar10 = ppFVar3[uVar18];
          if (pFVar10->ExprType == EFX_NamedNode) {
            if ((uVar13 & 1) == 0) {
              pcVar14 = 
              "Cannot use a named argument here - not all required arguments have been passed.";
            }
            else {
              if ((local_60 & 1) == 0) {
                uVar7 = (local_88->ArgNames).Count - (int)local_78;
                local_48 = uVar15;
                if (uVar7 != 0) {
                  uVar15 = 0;
LAB_00537585:
                  if ((local_88->ArgNames).Array[(uint)((int)uVar15 + (int)uVar17)].Index !=
                      *(int *)&pFVar10[1]._vptr_FxExpression) goto code_r0x00537593;
                  if (uVar18 <= (uVar15 & 0xffffffff)) {
                    ppFVar3[uVar18] = (FxExpression *)pFVar10[1].ScriptPosition.FileName.Chars;
                    pFVar10[1].ScriptPosition.FileName.Chars = (char *)0x0;
                    local_50 = this;
                    if (pFVar10 != (FxExpression *)0x0) {
                      (*pFVar10->_vptr_FxExpression[1])();
                    }
                    if (0 < (int)(uVar15 - uVar18)) {
                      uVar17 = 0;
                      do {
                        pPVar4 = PPointer::RegistrationInfo.MyClass;
                        uVar13 = (int)uVar17 + iVar6;
                        uVar16 = (ulong)((int)local_78 + uVar13);
                        pPVar9 = (PPointer *)(pPVar19->ArgumentTypes).Array[uVar16];
                        if ((*(byte *)((long)(local_88->ArgFlags).Array + uVar16 * 4 + 2) & 1) != 0)
                        {
                          if ((pPVar9->super_PBasicType).super_PType.super_PTypeBase.super_DObject.
                              Class == (PClass *)0x0) {
                            iVar8 = (**(pPVar9->super_PBasicType).super_PType.super_PTypeBase.
                                       super_DObject._vptr_DObject)(pPVar9);
                            (pPVar9->super_PBasicType).super_PType.super_PTypeBase.super_DObject.
                            Class = (PClass *)CONCAT44(extraout_var_02,iVar8);
                          }
                          pPVar11 = (pPVar9->super_PBasicType).super_PType.super_PTypeBase.
                                    super_DObject.Class;
                          bVar20 = pPVar11 != (PClass *)0x0;
                          if (pPVar11 != pPVar4 && bVar20) {
                            do {
                              pPVar11 = pPVar11->ParentClass;
                              bVar20 = pPVar11 != (PClass *)0x0;
                              if (pPVar11 == pPVar4) break;
                            } while (pPVar11 != (PClass *)0x0);
                          }
                          pPVar9 = TypeNullPtr;
                          if (!bVar20) {
                            __assert_fail("ntype->IsKindOf(RUNTIME_CLASS(PPointer))",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                                          ,0x1eb6,
                                          "virtual FxExpression *FxVMFunctionCall::Resolve(FCompileContext &)"
                                         );
                          }
                        }
                        this_01 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
                        FxConstant::FxConstant
                                  (this_01,(PType *)pPVar9,(local_40->DefaultArgs).Array + uVar16,
                                   local_90);
                        local_38 = this_01;
                        TArray<FxExpression_*,_FxExpression_*>::Insert
                                  (local_80,uVar13,(FxExpression **)&local_38);
                        uVar17 = uVar17 + 1;
                        pPVar19 = local_58;
                      } while (uVar17 < (uVar15 - uVar18 & 0xffffffff));
                    }
                    uVar13 = (int)local_78 + iVar6;
                    local_a0 = (pPVar19->ArgumentTypes).Array[uVar13];
                    uVar13 = (local_88->ArgFlags).Array[uVar13];
                    bVar20 = true;
                    uVar17 = local_70;
                    this = local_50;
                    goto LAB_005375d1;
                  }
                  pcVar14 = "Named argument %s comes before current position in argument list.";
                  goto LAB_005375c1;
                }
LAB_0053759b:
                pcVar14 = "Named argument %s not found.";
LAB_005375c1:
                bVar20 = false;
                FScriptPosition::Message(local_90,2,pcVar14);
                (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
LAB_005375d1:
                uVar15 = local_48;
                if (bVar20) goto LAB_005375de;
                goto LAB_00537406;
              }
              pcVar14 = "Cannot use a named argument in the varargs part of the parameter list.";
            }
            FScriptPosition::Message(local_90,2,pcVar14);
            goto LAB_005373fd;
          }
LAB_005375de:
          pTVar5 = local_80;
          if ((uVar13 & 0x10800) == 0) {
            this_00 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
            FxTypeCast::FxTypeCast
                      (this_00,((TArray<FxExpression_*,_FxExpression_*> *)&local_80->Array)->Array
                               [uVar18],local_a0,false,false);
            pPVar19 = local_58;
            iVar6 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,local_68);
            pFVar10 = (FxExpression *)CONCAT44(extraout_var_01,iVar6);
          }
          else {
            pFVar10 = ((TArray<FxExpression_*,_FxExpression_*> *)&local_80->Array)->Array[uVar18];
            iVar6 = (*pFVar10->_vptr_FxExpression[2])(pFVar10,local_68);
            ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar5->Array)->Array[uVar18] =
                 (FxExpression *)CONCAT44(extraout_var_00,iVar6);
            pFVar10 = ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar5->Array)->Array[uVar18];
            uVar17 = local_70;
            if ((pFVar10 != (FxExpression *)0x0) && ((PPointer *)pFVar10->ValueType != TypeNullPtr))
            {
              (*pFVar10->_vptr_FxExpression[4])(pFVar10,local_68,&local_91);
              pTVar5 = local_80;
              if ((uVar13 >> 0x10 & 1) != 0) {
                pPVar9 = NewPointer(((TArray<FxExpression_*,_FxExpression_*> *)&local_80->Array)->
                                    Array[uVar18]->ValueType,false);
                ((TArray<FxExpression_*,_FxExpression_*> *)&pTVar5->Array)->Array[uVar18]->ValueType
                     = (PType *)pPVar9;
              }
              uVar17 = local_70;
              pFVar10 = ((TArray<FxExpression_*,_FxExpression_*> *)&local_80->Array)->Array[uVar18];
              if (local_a0 != pFVar10->ValueType) {
                FScriptPosition::Message
                          (local_90,2,"Type mismatch in reference argument %s",
                           FName::NameData.NameArray
                           [*(int *)&(this->Function->super_PSymbol).super_PTypeBase.super_DObject.
                                     field_0x24].Text);
                pFVar10 = (FxExpression *)0x0;
              }
            }
          }
          uVar15 = CONCAT71((int7)(uVar15 >> 8),(byte)uVar15 | pFVar10 == (FxExpression *)0x0);
          (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar18] = pFVar10;
          uVar18 = uVar18 + 1;
        } while (uVar18 < (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count);
      }
      uVar13 = (int)local_78 + (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
      bVar20 = true;
      if (((uVar13 < (pPVar19->ArgumentTypes).Count) &&
          ((pPVar19->ArgumentTypes).Array[(int)uVar13] != (PType *)0x0)) &&
         (((((this->Function->Variants).Array)->ArgFlags).Array[(int)uVar13] & 1) == 0)) {
        pFVar10 = &this->super_FxExpression;
        pcVar14 = FName::NameData.NameArray
                  [*(int *)&(this->Function->super_PSymbol).super_PTypeBase.super_DObject.field_0x24
                  ].Text;
        message = "Insufficient arguments in call to %s";
        goto LAB_005373f1;
      }
    }
    else {
      pFVar10 = &this->super_FxExpression;
      pcVar14 = FName::NameData.NameArray
                [*(int *)&(pPVar1->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text;
      message = "Too many arguments in call to %s";
      uVar15 = 0;
LAB_005373f1:
      FScriptPosition::Message(&pFVar10->ScriptPosition,2,message,pcVar14);
LAB_005373fd:
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
LAB_00537406:
      bVar20 = false;
    }
    if (!bVar20) {
      return (FxExpression *)0x0;
    }
  }
  if ((uVar15 & 1) == 0) {
    if ((pPVar19->ReturnTypes).Count == 0) {
      ppPVar12 = &TypeVoid;
    }
    else {
      ppPVar12 = (PVoidType **)(pPVar19->ReturnTypes).Array;
    }
    (this->super_FxExpression).ValueType = &(*ppPVar12)->super_PType;
    return &this->super_FxExpression;
  }
LAB_0053746e:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
code_r0x00537593:
  uVar15 = uVar15 + 1;
  if (uVar7 == uVar15) goto LAB_0053759b;
  goto LAB_00537585;
}

Assistant:

FxExpression *FxVMFunctionCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Self, ctx);
	bool failed = false;
	auto proto = Function->Variants[0].Proto;
	auto &argtypes = proto->ArgumentTypes;
	auto &argnames = Function->Variants[0].ArgNames;
	auto &argflags = Function->Variants[0].ArgFlags;
	auto &defaults = Function->Variants[0].Implementation->DefaultArgs;

	int implicit = Function->GetImplicitArgs();

	// This should never happen.
	if (Self == nullptr && (Function->Variants[0].Flags & VARF_Method))
	{
		ScriptPosition.Message(MSG_ERROR, "Call to non-static function without a self pointer");
		delete this;
		return nullptr;
	}

	if (ArgList.Size() > 0)
	{
		bool foundvarargs = false;
		PType * type = nullptr;
		int flag = 0;
		if (argtypes.Last() != nullptr && ArgList.Size() + implicit > argtypes.Size())
		{
			ScriptPosition.Message(MSG_ERROR, "Too many arguments in call to %s", Function->SymbolName.GetChars());
			delete this;
			return nullptr;
		}

		for (unsigned i = 0; i < ArgList.Size(); i++)
		{
			// Varargs must all have the same type as the last typed argument. A_Jump is the only function using it.
			if (!foundvarargs)
			{
				if (argtypes[i + implicit] == nullptr) foundvarargs = true;
				else
				{
					type = argtypes[i + implicit];
					flag = argflags[i + implicit];
				}
			}
			assert(type != nullptr);

			if (ArgList[i]->ExprType == EFX_NamedNode)
			{
				if (!(flag & VARF_Optional))
				{
					ScriptPosition.Message(MSG_ERROR, "Cannot use a named argument here - not all required arguments have been passed.");
					delete this;
					return nullptr;
				}
				if (foundvarargs)
				{
					ScriptPosition.Message(MSG_ERROR, "Cannot use a named argument in the varargs part of the parameter list.");
					delete this;
					return nullptr;
				}
				unsigned j;
				bool done = false;
				FName name = static_cast<FxNamedNode *>(ArgList[i])->name;
				for (j = 0; j < argnames.Size() - implicit; j++)
				{
					if (argnames[j + implicit] == name)
					{
						if (j < i)
						{
							ScriptPosition.Message(MSG_ERROR, "Named argument %s comes before current position in argument list.", name.GetChars());
							delete this;
							return nullptr;
						}
						// copy the original argument into the list
						auto old = static_cast<FxNamedNode *>(ArgList[i]);
						ArgList[i] = old->value; 
						old->value = nullptr;
						delete old;
						// now fill the gap with constants created from the default list so that we got a full list of arguments.
						int insert = j - i;
						for (int k = 0; k < insert; k++)
						{
							auto ntype = argtypes[i + k + implicit];
							// If this is a reference argument, the pointer type must be undone because the code below expects the pointed type as value type.
							if (argflags[i + k + implicit] & VARF_Ref)
							{
								assert(ntype->IsKindOf(RUNTIME_CLASS(PPointer)));
								ntype = TypeNullPtr; // the default of a reference type can only be a null pointer
							}
							auto x = new FxConstant(ntype, defaults[i + k + implicit], ScriptPosition);
							ArgList.Insert(i + k, x);
						}
						done = true;
						break;
					}
				}
				if (!done)
				{
					ScriptPosition.Message(MSG_ERROR, "Named argument %s not found.", name.GetChars());
					delete this;
					return nullptr;
				}
				// re-get the proper info for the inserted node.
				type = argtypes[i + implicit];
				flag = argflags[i + implicit];
			}

			FxExpression *x;
			if (!(flag & (VARF_Ref|VARF_Out)))
			{
				x = new FxTypeCast(ArgList[i], type, false);
				x = x->Resolve(ctx);
			}
			else
			{
				bool writable;
				ArgList[i] = ArgList[i]->Resolve(ctx);	// nust be resolved before the address is requested.
				if (ArgList[i] != nullptr && ArgList[i]->ValueType != TypeNullPtr)
				{
					ArgList[i]->RequestAddress(ctx, &writable);
					if (flag & VARF_Ref) ArgList[i]->ValueType = NewPointer(ArgList[i]->ValueType);
					// For a reference argument the types must match 100%.
					if (type != ArgList[i]->ValueType)
					{
						ScriptPosition.Message(MSG_ERROR, "Type mismatch in reference argument %s", Function->SymbolName.GetChars());
						x = nullptr;
					}
					else
					{
						x = ArgList[i];
					}
				}
				else x = ArgList[i];
			}
			failed |= (x == nullptr);
			ArgList[i] = x;
		}
		int numargs = ArgList.Size() + implicit;
		if ((unsigned)numargs < argtypes.Size() && argtypes[numargs] != nullptr)
		{
			auto flags = Function->Variants[0].ArgFlags[numargs];
			if (!(flags & VARF_Optional))
			{
				ScriptPosition.Message(MSG_ERROR, "Insufficient arguments in call to %s", Function->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	else
	{
		if ((unsigned)implicit < argtypes.Size() && argtypes[implicit] != nullptr)
		{
			auto flags = Function->Variants[0].ArgFlags[implicit];
			if (!(flags & VARF_Optional))
			{
				ScriptPosition.Message(MSG_ERROR, "Insufficient arguments in call to %s", Function->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	if (failed)
	{
		delete this;
		return nullptr;
	}
	TArray<PType *> &rets = proto->ReturnTypes;
	if (rets.Size() > 0)
	{
		ValueType = rets[0];
	}
	else
	{
		ValueType = TypeVoid;
	}
	return this;
}